

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_last_not_of(StringPiece *this,StringPiece s,size_type pos)

{
  stringpiece_ssize_type sVar1;
  char *pcVar2;
  ulong uVar3;
  size_type sVar4;
  StringPiece characters_wanted;
  bool lookup [256];
  
  pcVar2 = (char *)s.length_;
  if (this->length_ < 1) {
    sVar4 = 0xffffffffffffffff;
  }
  else {
    uVar3 = this->length_ - 1;
    if (pos <= uVar3) {
      uVar3 = pos;
    }
    sVar4 = uVar3;
    if (0 < (long)pcVar2) {
      if (pcVar2 == (char *)0x1) {
        sVar1 = find_last_not_of(this,(char)*(protobuf *)s.ptr_,pos);
        return sVar1;
      }
      memset(lookup,0,0x100);
      characters_wanted.length_ = (stringpiece_ssize_type)lookup;
      characters_wanted.ptr_ = pcVar2;
      BuildLookupTable((protobuf *)s.ptr_,characters_wanted,(bool *)pos);
      while ((sVar4 = 0xffffffffffffffff, -1 < (long)uVar3 &&
             (sVar4 = uVar3, lookup[(byte)this->ptr_[uVar3]] == true))) {
        uVar3 = uVar3 - 1;
      }
    }
  }
  return sVar4;
}

Assistant:

stringpiece_ssize_type StringPiece::find_last_not_of(StringPiece s,
                                                     size_type pos) const {
  if (length_ <= 0) return npos;

  stringpiece_ssize_type i = std::min(pos, static_cast<size_type>(length_ - 1));
  if (s.length_ <= 0) return i;

  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_not_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (; i >= 0; --i) {
    if (!lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}